

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

int loop_once(int epoll,int sfd,epoll_event *event)

{
  long lVar1;
  byte *pbVar2;
  ssize_t sVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  byte *pbVar7;
  byte **ppbVar8;
  undefined1 *puVar9;
  byte *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  int local_36c;
  ulong uStack_368;
  int fd;
  unsigned_long __vla_expr0;
  ssize_t local_358;
  ssize_t len;
  int local_348;
  int res;
  int sd;
  socklen_t addrlen;
  sockaddr client_addr;
  int i;
  int cnt;
  epoll_event events [64];
  epoll_event *event_local;
  int sfd_local;
  int epoll_local;
  
  client_addr.sa_data._10_4_ = epoll_wait(epoll,(epoll_event *)&i,0x40,-1);
  client_addr.sa_data[6] = '\0';
  client_addr.sa_data[7] = '\0';
  client_addr.sa_data[8] = '\0';
  client_addr.sa_data[9] = '\0';
  ppbVar8 = &local_3b8;
LAB_00116e5e:
  if ((int)client_addr.sa_data._10_4_ <= (int)client_addr.sa_data._6_4_) {
    return 0;
  }
  puVar9 = (undefined1 *)ppbVar8;
  if (((((&i)[(long)(int)client_addr.sa_data._6_4_ * 3] & 8U) == 0) &&
      (((&i)[(long)(int)client_addr.sa_data._6_4_ * 3] & 0x10U) == 0)) &&
     (((&i)[(long)(int)client_addr.sa_data._6_4_ * 3] & 1U) != 0)) {
    if (*(int *)((long)&events[(long)(int)client_addr.sa_data._6_4_ + -1].data + 4) != sfd) {
      uStack_368 = (ulong)(uint)BUF_SIZE;
      lVar1 = -(uStack_368 + 0xf & 0xfffffffffffffff0);
      pbVar7 = (byte *)((long)ppbVar8 + lVar1);
      local_3b8 = pbVar7;
      __vla_expr0 = (unsigned_long)ppbVar8;
      do {
        pbVar2 = local_3b8;
        iVar4 = *(int *)((long)&events[(long)(int)client_addr.sa_data._6_4_ + -1].data + 4);
        local_36c = iVar4;
        builtin_memcpy((byte *)((long)ppbVar8 + lVar1 + -8),"\x1ds\x11",4);
        pbVar7[-4] = '\0';
        pbVar7[-3] = '\0';
        pbVar7[-2] = '\0';
        pbVar7[-1] = '\0';
        local_358 = read(iVar4,pbVar2,(long)BUF_SIZE);
        if (local_358 == -1) {
          builtin_memcpy((byte *)((long)ppbVar8 + lVar1 + -8),"3s\x11",4);
          pbVar7[-4] = '\0';
          pbVar7[-3] = '\0';
          pbVar7[-2] = '\0';
          pbVar7[-1] = '\0';
          piVar6 = __errno_location();
          iVar4 = local_36c;
          puVar9 = (undefined1 *)__vla_expr0;
          if (*piVar6 == 0xb) goto LAB_001173b4;
          builtin_memcpy((byte *)((long)ppbVar8 + lVar1 + -8),"Hs\x11",4);
          pbVar7[-4] = '\0';
          pbVar7[-3] = '\0';
          pbVar7[-2] = '\0';
          pbVar7[-1] = '\0';
          sk_on_read_error(epoll,iVar4);
        }
        else if (local_358 == 0) goto code_r0x00117354;
        sVar3 = local_358;
        iVar4 = local_36c;
        pbVar2 = local_3b8;
        pbVar7[-8] = 0xa1;
        pbVar7[-7] = 's';
        pbVar7[-6] = '\x11';
        pbVar7[-5] = '\0';
        pbVar7[-4] = '\0';
        pbVar7[-3] = '\0';
        pbVar7[-2] = '\0';
        pbVar7[-1] = '\0';
        sk_on_read_data(epoll,iVar4,pbVar2,(int)sVar3);
      } while( true );
    }
    while( true ) {
      while( true ) {
        res = 0x10;
        *(undefined8 *)((long)ppbVar8 + -8) = 0x116fe1;
        iVar4 = accept(sfd,(sockaddr *)&sd,(socklen_t *)&res);
        local_348 = iVar4;
        if (iVar4 == -1) break;
        *(undefined8 *)((long)ppbVar8 + -8) = 0x1170c8;
        len._4_4_ = make_socket_non_block(iVar4);
        iVar4 = local_348;
        if (len._4_4_ == -1) {
          *(undefined8 *)((long)ppbVar8 + -8) = 0x1170ee;
          pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
          if (pcVar5 == (char *)0x0) {
            *(undefined8 *)((long)ppbVar8 + -8) = 0x117123;
            pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
            if (pcVar5 == (char *)0x0) {
              local_3a0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
              ;
            }
            else {
              *(undefined8 *)((long)ppbVar8 + -8) = 0x11713a;
              local_3a0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                  ,0x5c);
              local_3a0 = local_3a0 + 1;
            }
            local_398 = local_3a0;
          }
          else {
            *(undefined8 *)((long)ppbVar8 + -8) = 0x117105;
            local_398 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                ,0x2f);
            local_398 = local_398 + 1;
          }
          pcVar5 = local_398;
          *(undefined8 *)((long)ppbVar8 + -8) = 0x117186;
          printf("\x1b[31mERROR: %s: %s: %d: cannot set flags!\x1b[m\n",pcVar5,"loop_once",0x6f);
          *(undefined8 *)((long)ppbVar8 + -8) = 0x11718e;
          sk_on_error(epoll);
          return -1;
        }
        (event->data).fd = local_348;
        event->events = 0x80000001;
        *(undefined8 *)((long)ppbVar8 + -8) = 0x1171c8;
        len._4_4_ = epoll_ctl(epoll,1,iVar4,(epoll_event *)event);
        iVar4 = local_348;
        if (len._4_4_ == -1) {
          *(undefined8 *)((long)ppbVar8 + -8) = 0x1171ee;
          pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
          if (pcVar5 == (char *)0x0) {
            *(undefined8 *)((long)ppbVar8 + -8) = 0x117223;
            pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
            if (pcVar5 == (char *)0x0) {
              local_3b0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
              ;
            }
            else {
              *(undefined8 *)((long)ppbVar8 + -8) = 0x11723a;
              local_3b0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                  ,0x5c);
              local_3b0 = local_3b0 + 1;
            }
            local_3a8 = local_3b0;
          }
          else {
            *(undefined8 *)((long)ppbVar8 + -8) = 0x117205;
            local_3a8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                ,0x2f);
            local_3a8 = local_3a8 + 1;
          }
          pcVar5 = local_3a8;
          *(undefined8 *)((long)ppbVar8 + -8) = 0x117286;
          printf("\x1b[31mERROR: %s: %s: %d: cannot add to epoll!\x1b[m\n",pcVar5,"loop_once",0x78);
          *(undefined8 *)((long)ppbVar8 + -8) = 0x11728e;
          sk_on_error(epoll);
          return -1;
        }
        *(undefined8 *)((long)ppbVar8 + -8) = 0x1172a8;
        sk_on_connected(epoll,iVar4);
      }
      *(undefined8 *)((long)ppbVar8 + -8) = 0x116ff9;
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) break;
      *(undefined8 *)((long)ppbVar8 + -8) = 0x117003;
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) break;
      *(undefined8 *)((long)ppbVar8 + -8) = 0x117020;
      pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x2f);
      if (pcVar5 == (char *)0x0) {
        *(undefined8 *)((long)ppbVar8 + -8) = 0x117055;
        pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x5c);
        if (pcVar5 == (char *)0x0) {
          local_390 = 
          "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
          ;
        }
        else {
          *(undefined8 *)((long)ppbVar8 + -8) = 0x11706c;
          local_390 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                              ,0x5c);
          local_390 = local_390 + 1;
        }
        local_388 = local_390;
      }
      else {
        *(undefined8 *)((long)ppbVar8 + -8) = 0x117037;
        local_388 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                            ,0x2f);
        local_388 = local_388 + 1;
      }
      pcVar5 = local_388;
      *(undefined8 *)((long)ppbVar8 + -8) = 0x1170b8;
      printf("\x1b[31mERROR: %s: %s: %d: cannot accept new socket!\x1b[m\n",pcVar5,"loop_once",0x68)
      ;
    }
  }
  else {
    *(undefined8 *)((long)ppbVar8 + -8) = 0x116ee4;
    pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      *(undefined8 *)((long)ppbVar8 + -8) = 0x116f19;
      pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x5c);
      if (pcVar5 == (char *)0x0) {
        local_380 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
        ;
      }
      else {
        *(undefined8 *)((long)ppbVar8 + -8) = 0x116f30;
        local_380 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                            ,0x5c);
        local_380 = local_380 + 1;
      }
      local_378 = local_380;
    }
    else {
      *(undefined8 *)((long)ppbVar8 + -8) = 0x116efb;
      local_378 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                          ,0x2f);
      local_378 = local_378 + 1;
    }
    pcVar5 = local_378;
    *(undefined8 *)((long)ppbVar8 + -8) = 0x116f7c;
    printf("\x1b[31mERROR: %s: %s: %d: socket fd error!\x1b[m\n",pcVar5,"loop_once",0x5a);
    iVar4 = *(int *)((long)&events[(long)(int)client_addr.sa_data._6_4_ + -1].data + 4);
    *(undefined8 *)((long)ppbVar8 + -8) = 0x116f99;
    close(iVar4);
  }
  goto LAB_001173b4;
code_r0x00117354:
  iVar4 = *(int *)((long)&events[(long)(int)client_addr.sa_data._6_4_ + -1].data + 4);
  builtin_memcpy((byte *)((long)ppbVar8 + lVar1 + -8),"qs\x11",4);
  pbVar7[-4] = '\0';
  pbVar7[-3] = '\0';
  pbVar7[-2] = '\0';
  pbVar7[-1] = '\0';
  close(iVar4);
  iVar4 = local_36c;
  builtin_memcpy((byte *)((long)ppbVar8 + lVar1 + -8),"\x7fs\x11",4);
  pbVar7[-4] = '\0';
  pbVar7[-3] = '\0';
  pbVar7[-2] = '\0';
  pbVar7[-1] = '\0';
  sk_on_disconnected(epoll,iVar4);
  puVar9 = (undefined1 *)__vla_expr0;
LAB_001173b4:
  client_addr.sa_data._6_4_ = client_addr.sa_data._6_4_ + 1;
  ppbVar8 = (byte **)puVar9;
  goto LAB_00116e5e;
}

Assistant:

static int loop_once(int epoll, int sfd, struct epoll_event &event)
{
    struct epoll_event events[MAX_EVENTS];
    int cnt = epoll_wait(epoll, events, MAX_EVENTS, -1);

    for (int i = 0; i < cnt; i++) {
        if ((events[i].events & EPOLLERR) || (events[i].events & EPOLLHUP) || !(events[i].events & EPOLLIN)) {
            LOGE("socket fd error!");
            close(events[i].data.fd);
            continue;

        } else if (events[i].data.fd == sfd) {
            while (1) {
                struct sockaddr client_addr;
                socklen_t addrlen = sizeof(struct sockaddr);

                int sd = accept(sfd, &client_addr, &addrlen);
                if (sd == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        break;
                    } else {
                        LOGE("cannot accept new socket!");
                        continue;
                    }
                }

                int res = make_socket_non_block(sd);
                if (res == -1) {
                    LOGE("cannot set flags!");
                    sk_on_error(epoll);
                    return -1;
                }

                event.data.fd = sd;
                event.events  = EPOLLET | EPOLLIN;
                res = epoll_ctl(epoll, EPOLL_CTL_ADD, sd, &event);
                if (res == -1) {
                    LOGE("cannot add to epoll!");
                    sk_on_error(epoll);
                    return -1;
                }

                sk_on_connected(epoll, sd);
            }
        } else {
            ssize_t len;
            byte buf[BUF_SIZE];

            while (1) {
                int fd = events[i].data.fd;
                len = read(fd, buf, BUF_SIZE);
                if (len == -1) {
                    if (errno == EAGAIN) {
                        break;
                    }

                    sk_on_read_error(epoll, fd);

                } else if (len == 0) {
                    close(events[i].data.fd);
                    sk_on_disconnected(epoll, fd);
                    break;
                }

                sk_on_read_data(epoll, fd, buf, len);
            }
        }
    }
    return 0;
}